

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O0

minisketch * minisketch_create(uint32_t bits,uint32_t implementation,size_t capacity)

{
  long lVar1;
  Sketch *pSVar2;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  bad_alloc *anon_var_0;
  bad_alloc *anon_var_0_1;
  Sketch *sketch;
  Sketch *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = anon_unknown.dwarf_250a9ab::Construct
                     (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  if (pSVar2 != (Sketch *)0x0) {
    (*pSVar2->_vptr_Sketch[3])(pSVar2,in_RDX);
    Sketch::Ready(in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (minisketch *)pSVar2;
  }
  __stack_chk_fail();
}

Assistant:

minisketch* minisketch_create(uint32_t bits, uint32_t implementation, size_t capacity) {
    try {
        Sketch* sketch = Construct(bits, implementation);
        if (sketch) {
            try {
                sketch->Init(capacity);
            } catch (const std::bad_alloc&) {
                delete sketch;
                throw;
            }
            sketch->Ready();
        }
        return (minisketch*)sketch;
    } catch (const std::bad_alloc&) {
        return nullptr;
    }
}